

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.h
# Opt level: O2

char * FindLatestMESMessage(char *str)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = FindMESMessage(str);
  pcVar2 = (char *)0x0;
  while (pcVar1 != (char *)0x0) {
    pcVar3 = FindMESMessage(pcVar1 + 1);
    pcVar2 = pcVar1;
    pcVar1 = pcVar3;
  }
  return pcVar2;
}

Assistant:

inline char* FindLatestMESMessage(char* str)
{
	char* ptr = NULL;
	char* foundstr = NULL;

	ptr = FindMESMessage(str);
	while (ptr) 
	{
		// Save the position of the beginning of the message.
		foundstr = ptr;

		// Search just after the beginning of the message.
		ptr = FindMESMessage(foundstr+1);
	}

	return foundstr;
}